

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::UdpEntrySyntax*>::
emplaceRealloc<slang::syntax::UdpEntrySyntax*>
          (SmallVectorBase<slang::syntax::UdpEntrySyntax*> *this,pointer pos,UdpEntrySyntax **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppUVar3;
  UdpEntrySyntax **__result;
  UdpEntrySyntax **ppUVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  UdpEntrySyntax **args_local;
  pointer pos_local;
  SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::max_size
                    ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::calculateGrowth
                       ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this,
                        *(long *)(this + 8) + 1);
  ppUVar3 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::begin
                      ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this);
  __result = (UdpEntrySyntax **)slang::detail::allocArray(capacity,8);
  ppUVar4 = __result + ((long)pos - (long)ppUVar3 >> 3);
  *ppUVar4 = *args;
  ppUVar3 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::end
                      ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this);
  if (pos == ppUVar3) {
    ppUVar3 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::end
                    ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this);
    std::uninitialized_move<slang::syntax::UdpEntrySyntax**,slang::syntax::UdpEntrySyntax**>
              (ppUVar3,(UdpEntrySyntax **)ctx,__result);
  }
  else {
    ppUVar3 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this);
    std::uninitialized_move<slang::syntax::UdpEntrySyntax**,slang::syntax::UdpEntrySyntax**>
              (ppUVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::end
                    ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this);
    std::uninitialized_move<slang::syntax::UdpEntrySyntax**,slang::syntax::UdpEntrySyntax**>
              (pos,(UdpEntrySyntax **)ctx,ppUVar4 + 1);
  }
  SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::cleanup
            ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(UdpEntrySyntax ***)this = __result;
  return ppUVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}